

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_hub.cpp
# Opt level: O2

FHubInfo * __thiscall FHubInfo::operator=(FHubInfo *this,wbstartstruct_t *wbs)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  this->finished_ep = wbs->finished_ep;
  iVar1 = wbs->maxitems;
  iVar2 = wbs->maxsecret;
  iVar3 = wbs->maxfrags;
  this->maxkills = wbs->maxkills;
  this->maxitems = iVar1;
  this->maxsecret = iVar2;
  this->maxfrags = iVar3;
  memcpy(this->plyr,wbs->plyr,0x1c0);
  return this;
}

Assistant:

FHubInfo &operator=(const wbstartstruct_t &wbs)
	{
		finished_ep = wbs.finished_ep;
		maxkills = wbs.maxkills;
		maxsecret= wbs.maxsecret;
		maxitems = wbs.maxitems;
		maxfrags = wbs.maxfrags;
		memcpy(plyr, wbs.plyr, sizeof(plyr));
		return *this;
	}